

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O2

shared_ptr<int> __thiscall
(anonymous_namespace)::roundtrip<std::shared_ptr<int>>
          (_anonymous_namespace_ *this,shared_ptr<int> *in)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Result *in_R9;
  shared_ptr<int> sVar1;
  ExpressionDecomposer local_1e4;
  unsigned_long local_1e0;
  Expression_lhs<unsigned_long> local_1d8;
  Result local_1c8;
  OutputStream ostream;
  stringstream stream;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  std::ios::exceptions((int)*(undefined8 *)(_stream + -0x18) + (int)(stringstream *)&stream);
  ostream.stream = &stream;
  mserialize::detail::BuiltinSerializer<std::shared_ptr<int>,_void>::serialize<OutputStream>
            (in,&ostream);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_1e4,DT_CHECK);
  local_1d8.lhs = std::ostream::tellp();
  local_1d8.m_at = local_1e4.m_at;
  local_1e0 = (ulong)((in->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
                     (element_type *)0x0) * 4 + 1;
  doctest::detail::Expression_lhs<unsigned_long>::operator==(&local_1c8,&local_1d8,&local_1e0);
  doctest::detail::decomp_assert
            ((detail *)0xa,0x18c19c,(char *)0x36,0x18c3cc,&local_1c8.m_passed,in_R9);
  doctest::String::~String(&local_1c8.m_decomp);
  local_1d8.lhs = (unsigned_long)&stream;
  mserialize::detail::BuiltinDeserializer<std::shared_ptr<int>,_void>::deserialize<InputStream>
            ((shared_ptr<int> *)this,(InputStream *)&local_1d8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  sVar1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<int>)sVar1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

T roundtrip(const T& in)
{
  T out;
  roundtrip_into(in, out);
  return out;
}